

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O3

void __thiscall Entity::spawn(Entity *this)

{
  int type;
  PowerUp *this_00;
  _List_node_base *p_Var1;
  
  type = this->powerup;
  if (-1 < type) {
    this_00 = (PowerUp *)operator_new(0x50);
    PowerUp::PowerUp(this_00,this->x,this->y,type);
    p_Var1 = (_List_node_base *)operator_new(0x18);
    p_Var1[1]._M_next = (_List_node_base *)this_00;
    std::__detail::_List_node_base::_M_hook(p_Var1);
    new_entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl._M_node.
    _M_size = new_entities_abi_cxx11_.super__List_base<Entity_*,_std::allocator<Entity_*>_>._M_impl.
              _M_node._M_size + 1;
  }
  return;
}

Assistant:

void Entity::spawn(void)
{
   if (powerup >= 0) {
      PowerUp *p = new PowerUp(x, y, powerup);
      new_entities.push_back(p);
   }
}